

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<8,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<8,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  iterator __position;
  TriangleMesh *pTVar10;
  BuildPrim *pBVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar29;
  undefined1 in_ZMM0 [64];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  vuint4 vgeomID;
  vuint4 vprimID;
  undefined1 local_f8 [16];
  MutexSys *local_e8;
  char cStack_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  ThreadLocal2 *local_b8;
  char cStack_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  CreateMortonLeaf<8,_embree::TriangleMv<4>_> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  auVar28 = in_ZMM0._0_16_;
  uVar5 = current->_begin;
  uVar6 = current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = 0xb0;
  this_01 = pTVar9->parent;
  local_80 = this;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    cStack_b0 = '\x01';
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    cStack_e0 = '\x01';
    auVar28 = (undefined1  [16])0x0;
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = local_78;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (cStack_e0 == '\x01') {
      MutexSys::unlock(local_e8);
    }
    if (cStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  pTVar9->bytesUsed = pTVar9->bytesUsed + local_f8._0_8_;
  sVar23 = pTVar9->cur;
  uVar24 = (ulong)(-(int)sVar23 & 0xf);
  uVar21 = sVar23 + local_f8._0_8_ + uVar24;
  pTVar9->cur = uVar21;
  if (pTVar9->end < uVar21) {
    pTVar9->cur = sVar23;
    if ((MutexSys *)pTVar9->allocBlockSize < (MutexSys *)(local_f8._0_8_ << 2)) {
      pauVar22 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_f8);
    }
    else {
      local_e8 = (MutexSys *)pTVar9->allocBlockSize;
      pauVar22 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar9->ptr = (char *)pauVar22;
      sVar23 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar23;
      pTVar9->cur = 0;
      pTVar9->end = (size_t)local_e8;
      pTVar9->cur = local_f8._0_8_;
      if (local_e8 < (ulong)local_f8._0_8_) {
        pTVar9->cur = 0;
        local_e8 = (MutexSys *)pTVar9->allocBlockSize;
        pauVar22 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar9->ptr = (char *)pauVar22;
        sVar23 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar23;
        pTVar9->cur = 0;
        pTVar9->end = (size_t)local_e8;
        pTVar9->cur = local_f8._0_8_;
        if (local_e8 < (ulong)local_f8._0_8_) {
          pTVar9->cur = 0;
          pauVar22 = (undefined1 (*) [16])0x0;
          goto LAB_0155b93e;
        }
      }
      pTVar9->bytesWasted = sVar23;
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar24;
    pauVar22 = (undefined1 (*) [16])(pTVar9->ptr + (uVar21 - local_f8._0_8_));
  }
LAB_0155b93e:
  local_f8 = vpcmpeqd_avx(auVar28,auVar28);
  uStack_c8 = 0;
  uStack_c0 = 0;
  local_e8 = (MutexSys *)0x0;
  cStack_e0 = 0;
  uStack_df = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_b8 = (ThreadLocal2 *)0x0;
  cStack_b0 = 0;
  uStack_af = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_78 = (ThreadLocal2 *)0x0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_48 = local_f8;
  if (uVar6 == uVar5) {
    aVar29.m128[2] = INFINITY;
    aVar29._0_8_ = 0x7f8000007f800000;
    aVar29.m128[3] = INFINITY;
    aVar30.m128[2] = -INFINITY;
    aVar30._0_8_ = 0xff800000ff800000;
    aVar30.m128[3] = -INFINITY;
  }
  else {
    iVar26 = uVar6 - uVar5;
    pTVar10 = local_80->mesh;
    pBVar11 = local_80->morton;
    lVar12 = *(long *)&(pTVar10->super_Geometry).field_0x58;
    lVar13 = *(long *)&pTVar10->field_0x68;
    pcVar14 = (pTVar10->vertices0).super_RawBufferView.ptr_ofs;
    sVar23 = (pTVar10->vertices0).super_RawBufferView.stride;
    uVar6 = local_80->geomID_;
    aVar30.m128[2] = -INFINITY;
    aVar30._0_8_ = 0xff800000ff800000;
    aVar30.m128[3] = -INFINITY;
    aVar29.m128[2] = INFINITY;
    aVar29._0_8_ = 0x7f8000007f800000;
    aVar29.m128[3] = INFINITY;
    lVar25 = 0;
    do {
      uVar7 = *(uint *)((long)&pBVar11[uVar5].field_0 + lVar25 * 2 + 4);
      lVar27 = (ulong)uVar7 * lVar13;
      auVar28 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + lVar27) * sVar23);
      auVar3 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 4 + lVar27) * sVar23);
      auVar4 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 8 + lVar27) * sVar23);
      auVar15 = vminps_avx((undefined1  [16])aVar29,auVar28);
      auVar16 = vminps_avx(auVar3,auVar4);
      aVar29 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vminps_avx(auVar15,auVar16);
      *(int *)((long)&local_e8 + lVar25) = auVar28._0_4_;
      uVar8 = vextractps_avx(auVar28,1);
      *(undefined4 *)((long)&uStack_d8 + lVar25) = uVar8;
      auVar15 = vmaxps_avx((undefined1  [16])aVar30,auVar28);
      uVar8 = vextractps_avx(auVar28,2);
      *(undefined4 *)((long)&uStack_c8 + lVar25) = uVar8;
      *(int *)((long)&local_b8 + lVar25) = auVar3._0_4_;
      uVar8 = vextractps_avx(auVar3,1);
      *(undefined4 *)((long)&uStack_a8 + lVar25) = uVar8;
      auVar28 = vmaxps_avx(auVar3,auVar4);
      uVar8 = vextractps_avx(auVar3,2);
      *(undefined4 *)((long)&uStack_98 + lVar25) = uVar8;
      *(int *)((long)&local_78 + lVar25) = auVar4._0_4_;
      uVar8 = vextractps_avx(auVar4,1);
      *(undefined4 *)((long)&uStack_68 + lVar25) = uVar8;
      aVar30 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar15,auVar28);
      uVar8 = vextractps_avx(auVar4,2);
      *(undefined4 *)((long)&uStack_58 + lVar25) = uVar8;
      *(uint *)(local_f8 + lVar25) = uVar6;
      *(uint *)(local_48 + lVar25) = uVar7;
      lVar25 = lVar25 + 4;
    } while ((ulong)(iVar26 + (uint)(iVar26 == 0)) << 2 != lVar25);
  }
  auVar28[8] = cStack_e0;
  auVar28._0_8_ = local_e8;
  auVar28._9_7_ = uStack_df;
  auVar3._8_8_ = uStack_d0;
  auVar3._0_8_ = uStack_d8;
  auVar4._8_8_ = uStack_c0;
  auVar4._0_8_ = uStack_c8;
  auVar15[8] = cStack_b0;
  auVar15._0_8_ = local_b8;
  auVar15._9_7_ = uStack_af;
  auVar16._8_8_ = uStack_a0;
  auVar16._0_8_ = uStack_a8;
  auVar17._8_8_ = uStack_90;
  auVar17._0_8_ = uStack_98;
  auVar18._8_8_ = uStack_70;
  auVar18._0_8_ = local_78;
  auVar19._8_8_ = uStack_60;
  auVar19._0_8_ = uStack_68;
  auVar20._8_8_ = uStack_50;
  auVar20._0_8_ = uStack_58;
  auVar28 = vmovntps_avx(auVar28);
  *pauVar22 = auVar28;
  auVar28 = vmovntps_avx(auVar3);
  pauVar22[1] = auVar28;
  auVar28 = vmovntps_avx(auVar4);
  pauVar22[2] = auVar28;
  auVar28 = vmovntps_avx(auVar15);
  pauVar22[3] = auVar28;
  auVar28 = vmovntps_avx(auVar16);
  pauVar22[4] = auVar28;
  auVar28 = vmovntps_avx(auVar17);
  pauVar22[5] = auVar28;
  auVar28 = vmovntps_avx(auVar18);
  pauVar22[6] = auVar28;
  auVar28 = vmovntps_avx(auVar19);
  pauVar22[7] = auVar28;
  auVar28 = vmovntps_avx(auVar20);
  pauVar22[8] = auVar28;
  auVar28 = vmovntps_avx(local_f8);
  pauVar22[9] = auVar28;
  auVar28 = vmovntps_avx(local_48);
  pauVar22[10] = auVar28;
  (__return_storage_ptr__->ref).ptr = (ulong)pauVar22 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar29;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar30;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }